

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkipList.hpp
# Opt level: O3

bool __thiscall
Lib::
SkipList<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_*,_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::SListIntermediateNode::NodePtrComparator>
::getPosition<Kernel::TermList::Top>
          (SkipList<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_*,_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::SListIntermediateNode::NodePtrComparator>
           *this,Top key,Node ***pvalue,bool canCreate)

{
  Top key_00;
  bool bVar1;
  ResultOf<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Coproduct_hpp:647:37),_Constant<0>_>
  RVar2;
  Node *pNVar3;
  Node *pNVar4;
  uint uVar5;
  byte bVar6;
  Top TVar7;
  anon_class_16_2_441c8d4f f;
  RawCoproduct<Kernel::VarNumber,Kernel::SymbolId> local_60;
  undefined7 uStack_5f;
  undefined4 local_58;
  Node ***local_50;
  SkipList<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_*,_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::SListIntermediateNode::NodePtrComparator>
  *local_48;
  Coproduct<Kernel::VarNumber,_Kernel::SymbolId> local_40;
  
  TVar7._inner._inner._0_8_ = key._inner._inner._0_8_;
  local_60 = key._inner._inner._0_1_;
  uStack_5f = key._inner._inner._content._0_7_;
  local_58 = CONCAT31(local_58._1_3_,key._inner._inner._content[7]);
  *pvalue = (Node **)0x0;
  local_50 = pvalue;
  if (this->_top == 0) {
    if (!canCreate) {
      return false;
    }
    TVar7._inner._inner._8_4_ = key._inner._inner._8_4_ & 0xff;
    pNVar3 = (Node *)insertPositionRaw<Kernel::TermList::Top>(this,TVar7);
  }
  else {
    uVar5 = this->_top - 1;
    pNVar3 = this->_left;
    local_48 = this;
LAB_0031c9d6:
    pNVar4 = pNVar3;
    do {
      pNVar3 = pNVar4->nodes[uVar5];
      if (pNVar3 == (Node *)0x0) break;
      TVar7 = Kernel::TermList::top(&pNVar3->value->_term);
      local_40._inner._0_8_ = TVar7._inner._inner._0_8_;
      bVar6 = TVar7._inner._inner._0_1_ & 1;
      local_40._inner._content[7] = TVar7._inner._inner._content[7];
      if (((byte)local_60 & 1) == bVar6) {
        f.rhs = &local_40;
        f.lhs = (Coproduct<Kernel::VarNumber,_Kernel::SymbolId> *)&local_60;
        RVar2 = CoproductImpl::RawCoproduct<Kernel::VarNumber,Kernel::SymbolId>::operator()
                          (&local_60,f);
      }
      else {
        RVar2 = -(uint)(((byte)local_60 & 1) < bVar6) | GREATER;
      }
      if (RVar2 == GREATER) goto LAB_0031c9d6;
      if (RVar2 == EQUAL) {
        bVar1 = true;
        goto LAB_0031ca66;
      }
    } while (RVar2 != LESS);
    if (uVar5 != 0) {
      uVar5 = uVar5 - 1;
      pNVar3 = pNVar4;
      goto LAB_0031c9d6;
    }
    if (!canCreate) {
      return false;
    }
    key_00._inner._inner._content[0] = (undefined1)uStack_5f;
    key_00._inner._inner._content[1] = uStack_5f._1_1_;
    key_00._inner._inner._content[2] = uStack_5f._2_1_;
    key_00._inner._inner._content[3] = uStack_5f._3_1_;
    key_00._inner._inner._content[4] = uStack_5f._4_1_;
    key_00._inner._inner._content[5] = uStack_5f._5_1_;
    key_00._inner._inner._content[6] = uStack_5f._6_1_;
    key_00._inner._inner._0_1_ = local_60;
    key_00._inner._inner._8_4_ = local_58;
    pNVar3 = (Node *)insertPositionRaw<Kernel::TermList::Top>(local_48,key_00);
  }
  pNVar3->value = (Node *)0x0;
  bVar1 = false;
LAB_0031ca66:
  *local_50 = &pNVar3->value;
  return bVar1;
}

Assistant:

bool getPosition(Key key, Value*& pvalue, bool canCreate)
  {
    pvalue = nullptr;

    if(_top==0) {
      if(canCreate) {
	pvalue = insertPosition(key);
      }
      return false;
    }

    unsigned h = _top-1;

   // left is a node with a value smaller than that of newNode and having
    // a large enough height.
    // this node is on the left of the inserted one
    Node* left = _left;
    for (;;) {
      Node* next = left->nodes[h];
      if (next == 0) {
	if (h == 0) {
	    if(canCreate) {
	      pvalue=insertPosition(key);
	    }
	    return false;
	}
	h--;
	continue;
      }
      // next != 0
      switch (ValueComparator::compare(key,next->value))
	{
	case LESS:
	  // the node should be inserted on the left
	  if (h == 0) {
	    if(canCreate) {
	      pvalue=insertPosition(key);
	    }
	    return false;
	  }
	  h--;
	  break;

	case EQUAL:
	  pvalue=&next->value;
	  return true;

	case GREATER:
	  left = next;
	  break;

#if VDEBUG
	default:
	  ASSERTION_VIOLATION;
#endif
	}
    }
  }